

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

int ApplyTxInUndo(Coin *undo,CCoinsViewCache *view,COutPoint *out)

{
  long lVar1;
  uint uVar2;
  Coin *pCVar3;
  uint uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (*(view->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])(view,out);
  if (*(uint *)&undo->field_0x28 < 2) {
    pCVar3 = AccessByTxid(view,&out->hash);
    if ((pCVar3->out).nValue == -1) {
      uVar4 = 2;
      goto LAB_0035ff68;
    }
    uVar4 = *(uint *)&pCVar3->field_0x28 & 0xfffffffe;
    *(uint *)&undo->field_0x28 = *(uint *)&undo->field_0x28 & 1 | uVar4;
    *(uint *)&undo->field_0x28 = *(uint *)&pCVar3->field_0x28 & 1 | uVar4;
  }
  uVar4 = uVar2 & 0xff;
  CCoinsViewCache::AddCoin(view,out,undo,SUB41(uVar2,0));
LAB_0035ff68:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

int ApplyTxInUndo(Coin&& undo, CCoinsViewCache& view, const COutPoint& out)
{
    bool fClean = true;

    if (view.HaveCoin(out)) fClean = false; // overwriting transaction output

    if (undo.nHeight == 0) {
        // Missing undo metadata (height and coinbase). Older versions included this
        // information only in undo records for the last spend of a transactions'
        // outputs. This implies that it must be present for some other output of the same tx.
        const Coin& alternate = AccessByTxid(view, out.hash);
        if (!alternate.IsSpent()) {
            undo.nHeight = alternate.nHeight;
            undo.fCoinBase = alternate.fCoinBase;
        } else {
            return DISCONNECT_FAILED; // adding output for transaction without known metadata
        }
    }
    // If the coin already exists as an unspent coin in the cache, then the
    // possible_overwrite parameter to AddCoin must be set to true. We have
    // already checked whether an unspent coin exists above using HaveCoin, so
    // we don't need to guess. When fClean is false, an unspent coin already
    // existed and it is an overwrite.
    view.AddCoin(out, std::move(undo), !fClean);

    return fClean ? DISCONNECT_OK : DISCONNECT_UNCLEAN;
}